

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_state.c
# Opt level: O0

void lj_state_free(global_State *g,lua_State *L)

{
  undefined4 uVar1;
  long lVar2;
  ulong in_RSI;
  long in_RDI;
  TValue *in_stack_ffffffffffffffd8;
  lua_State *in_stack_ffffffffffffffe0;
  
  if (in_RSI == *(uint *)(in_RDI + 0x188)) {
    *(undefined4 *)(in_RDI + 0x188) = 0;
  }
  lj_func_closeuv(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  uVar1 = *(undefined4 *)(in_RSI + 0x24);
  lVar2 = (ulong)*(uint *)(in_RSI + 0x38) * 8;
  *(int *)(in_RDI + 0x50) = *(int *)(in_RDI + 0x50) - (int)lVar2;
  *(long *)(in_RDI + 0x90) = lVar2 + *(long *)(in_RDI + 0x90);
  (**(code **)(in_RDI + 0x40))(*(undefined8 *)(in_RDI + 0x48),uVar1,lVar2,0);
  *(int *)(in_RDI + 0x50) = *(int *)(in_RDI + 0x50) + -0x40;
  *(long *)(in_RDI + 0x90) = *(long *)(in_RDI + 0x90) + 0x40;
  (**(code **)(in_RDI + 0x40))(*(undefined8 *)(in_RDI + 0x48),in_RSI,0x40,0);
  return;
}

Assistant:

void LJ_FASTCALL lj_state_free(global_State *g, lua_State *L)
{
  lj_assertG(L != mainthread(g), "free of main thread");
  if (obj2gco(L) == gcref(g->cur_L))
    setgcrefnull(g->cur_L);
  lj_func_closeuv(L, tvref(L->stack));
  lj_assertG(gcref(L->openupval) == NULL, "stale open upvalues");
  lj_mem_freevec(g, tvref(L->stack), L->stacksize, TValue);
  lj_mem_freet(g, L);
}